

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O1

bool S2ShapeIndexCell::DecodeEdges(int num_edges,S2ClippedShape *clipped,Decoder *decoder)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint in_R10D;
  uint uVar7;
  long lVar8;
  uchar *limit;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  uint uVar12;
  int *piVar13;
  
  iVar6 = 0;
  iVar5 = 0;
  do {
    iVar4 = iVar5;
    if (num_edges <= iVar4) break;
    pbVar1 = decoder->buf_;
    pbVar2 = decoder->limit_;
    if (pbVar1 < pbVar2) {
      pbVar11 = pbVar1 + 1;
      uVar12 = *pbVar1 & 0x7f;
      if ((char)*pbVar1 < '\0') {
        if (pbVar2 <= pbVar11) goto LAB_00224d51;
        uVar12 = (pbVar1[1] & 0x7f) << 7 | uVar12;
        pbVar11 = pbVar1 + 2;
        if ((char)pbVar1[1] < '\0') {
          if (pbVar2 <= pbVar1 + 2) goto LAB_00224d51;
          pbVar11 = pbVar1 + 3;
          uVar12 = (pbVar1[2] & 0x7f) << 0xe | uVar12;
          if ((char)pbVar1[2] < '\0') {
            if (pbVar2 <= pbVar11) goto LAB_00224d51;
            uVar12 = (pbVar1[3] & 0x7f) << 0x15 | uVar12;
            pbVar11 = pbVar1 + 4;
            if ((char)pbVar1[3] < '\0') {
              if (pbVar2 <= pbVar1 + 4) goto LAB_00224d51;
              pbVar11 = pbVar1 + 5;
              uVar12 = (uint)pbVar1[4] << 0x1c | uVar12;
              if (0xf < pbVar1[4]) {
                pbVar11 = (byte *)0x0;
                uVar12 = in_R10D;
              }
            }
          }
        }
      }
    }
    else {
LAB_00224d51:
      pbVar11 = (byte *)0x0;
      uVar12 = in_R10D;
    }
    if (pbVar11 == (byte *)0x0) {
LAB_00224d82:
      bVar3 = false;
      iVar5 = iVar4;
    }
    else {
      decoder->buf_ = pbVar11;
      if (iVar4 + 1 == num_edges) {
        if (*(uint *)&clipped->field_0x4 < 6) {
          *(uint *)((long)&clipped->field_3 + (long)iVar4 * 4) = uVar12 + iVar6;
        }
        else {
          (clipped->field_3).edges_[iVar4] = uVar12 + iVar6;
        }
        bVar3 = true;
        iVar5 = iVar4 + 1;
      }
      else {
        iVar5 = (uVar12 & 7) + 1;
        uVar7 = uVar12 >> 3;
        uVar12 = uVar7;
        if (iVar5 == 8) {
          pbVar1 = decoder->buf_;
          if (pbVar1 < pbVar2) {
            uVar12 = *pbVar1 & 0x7f;
            pbVar11 = pbVar1 + 1;
            if ((char)*pbVar1 < '\0') {
              if (pbVar2 <= pbVar1 + 1) goto LAB_00224e6b;
              uVar12 = uVar12 | (pbVar1[1] & 0x7f) << 7;
              pbVar11 = pbVar1 + 2;
              if ((char)pbVar1[1] < '\0') {
                if (pbVar2 <= pbVar1 + 2) goto LAB_00224e6b;
                uVar12 = uVar12 | (pbVar1[2] & 0x7f) << 0xe;
                pbVar11 = pbVar1 + 3;
                if ((char)pbVar1[2] < '\0') {
                  if (pbVar2 <= pbVar1 + 3) goto LAB_00224e6b;
                  uVar12 = uVar12 | (pbVar1[3] & 0x7f) << 0x15;
                  pbVar11 = pbVar1 + 4;
                  if ((char)pbVar1[3] < '\0') {
                    if (pbVar2 <= pbVar1 + 4) goto LAB_00224e6b;
                    pbVar11 = pbVar1 + 5;
                    uVar12 = (uint)pbVar1[4] << 0x1c | uVar12;
                    if (0xf < pbVar1[4]) {
                      pbVar11 = (byte *)0x0;
                      uVar12 = uVar7;
                    }
                  }
                }
              }
            }
          }
          else {
LAB_00224e6b:
            pbVar11 = (byte *)0x0;
            uVar12 = uVar7;
          }
          if (pbVar11 == (byte *)0x0) goto LAB_00224d82;
          iVar5 = uVar7 + 8;
          decoder->buf_ = pbVar11;
        }
        iVar6 = iVar6 + uVar12;
        lVar8 = (long)iVar4;
        lVar9 = lVar8 * 4;
        iVar10 = 0;
        do {
          if (*(uint *)&clipped->field_0x4 < 6) {
            piVar13 = (int *)((long)&clipped->field_3 + lVar8 * 4);
          }
          else {
            piVar13 = (int *)((long)(clipped->field_3).edges_ + lVar9);
          }
          *piVar13 = iVar6;
          lVar8 = lVar8 + 1;
          iVar6 = iVar6 + 1;
          lVar9 = lVar9 + 4;
          iVar10 = iVar10 + -1;
        } while (-iVar5 != iVar10);
        bVar3 = true;
        iVar5 = iVar4 - iVar10;
      }
    }
    in_R10D = uVar12;
  } while (bVar3);
  return num_edges <= iVar4;
}

Assistant:

inline bool S2ShapeIndexCell::DecodeEdges(int num_edges,
                                          S2ClippedShape* clipped,
                                          Decoder* decoder) {
  // This function inverts the encodings documented above.
  int32 edge_id = 0;
  for (int i = 0; i < num_edges; ) {
    uint32 delta;
    if (!decoder->get_varint32(&delta)) return false;
    if (i + 1 == num_edges) {
      // The last edge is encoded without an edge count.
      clipped->set_edge(i++, edge_id + delta);
    } else {
      // Otherwise decode the count and edge delta.
      uint32 count = (delta & 7) + 1;
      delta >>= 3;
      if (count == 8) {
        count = delta + 8;
        if (!decoder->get_varint32(&delta)) return false;
      }
      edge_id += delta;
      for (; count > 0; --count, ++i, ++edge_id) {
        clipped->set_edge(i, edge_id);
      }
    }
  }
  return true;
}